

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::AddConcavePolyFilled(ImDrawList *this,ImVec2 *points,int points_count,ImU32 col)

{
  uint uVar1;
  uint uVar2;
  ImVec2 IVar3;
  ImDrawVert *pIVar4;
  uint *puVar5;
  ImVec2 *pIVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  float fVar14;
  float fVar15;
  ImVec2 IVar16;
  ImVec2 IVar17;
  uint triangle [3];
  ImTriangulator triangulator;
  uint local_a0;
  int iStack_9c;
  int local_98;
  int local_94;
  uint *local_90;
  undefined1 local_88 [24];
  int local_70;
  ImTriangulatorNode **local_68;
  int local_60;
  undefined1 local_58 [16];
  uint local_48;
  uint uStack_44;
  undefined8 uStack_40;
  
  if (0xffffff < col && 2 < points_count) {
    IVar3 = this->_Data->TexUvWhitePixel;
    local_88._0_4_ = 0;
    local_68 = (ImTriangulatorNode **)0x0;
    local_60 = 0;
    local_70 = 0;
    local_88._8_16_ = (undefined1  [16])0x0;
    if ((this->Flags & 4) == 0) {
      PrimReserve(this,points_count * 3 + -6,points_count);
      for (uVar7 = 0; (uint)points_count != uVar7; uVar7 = uVar7 + 1) {
        this->_VtxWritePtr->pos = points[uVar7];
        this->_VtxWritePtr->uv = IVar3;
        pIVar4 = this->_VtxWritePtr;
        pIVar4->col = col;
        this->_VtxWritePtr = pIVar4 + 1;
      }
      ImVector<ImVec2>::reserve_discard(&this->_Data->TempBuffer,(points_count * 0x30 >> 3) + 1);
      ImTriangulator::Init
                ((ImTriangulator *)local_88,points,points_count,(this->_Data->TempBuffer).Data);
      local_90 = &this->_VtxCurrentIdx;
      while (local_94 = points_count, 0 < (int)local_88._0_4_) {
        ImTriangulator::GetNextTriangle((ImTriangulator *)local_88,&local_a0);
        puVar5 = this->_IdxWritePtr;
        *puVar5 = local_a0 + this->_VtxCurrentIdx;
        puVar5[1] = iStack_9c + this->_VtxCurrentIdx;
        puVar5[2] = local_98 + this->_VtxCurrentIdx;
        this->_IdxWritePtr = puVar5 + 3;
      }
    }
    else {
      local_58 = ZEXT416((uint)this->_FringeScale);
      local_94 = points_count * 2;
      PrimReserve(this,points_count * 9 + -6,local_94);
      local_90 = &this->_VtxCurrentIdx;
      uVar2 = this->_VtxCurrentIdx;
      ImVector<ImVec2>::reserve_discard(&this->_Data->TempBuffer,(points_count * 0x30 >> 3) + 1);
      ImTriangulator::Init
                ((ImTriangulator *)local_88,points,points_count,(this->_Data->TempBuffer).Data);
      uStack_40 = 0;
      local_48 = uVar2;
      uStack_44 = uVar2;
      while (0 < (int)local_88._0_4_) {
        ImTriangulator::GetNextTriangle((ImTriangulator *)local_88,&local_a0);
        puVar5 = this->_IdxWritePtr;
        *(ulong *)puVar5 = CONCAT44(iStack_9c * 2 + uStack_44,local_a0 * 2 + local_48);
        puVar5[2] = uVar2 + local_98 * 2;
        this->_IdxWritePtr = puVar5 + 3;
      }
      ImVector<ImVec2>::reserve_discard(&this->_Data->TempBuffer,points_count);
      pIVar6 = (this->_Data->TempBuffer).Data;
      iVar10 = points_count + -1;
      iVar8 = iVar10;
      for (uVar7 = 0; (uint)points_count != uVar7; uVar7 = uVar7 + 1) {
        fVar11 = points[uVar7].x - points[iVar8].x;
        fVar12 = points[uVar7].y - points[iVar8].y;
        auVar13._0_4_ = fVar11 * fVar11 + fVar12 * fVar12;
        auVar13._4_4_ = fVar12;
        auVar13._8_8_ = 0;
        if (0.0 < auVar13._0_4_) {
          auVar13 = rsqrtss(auVar13,auVar13);
          fVar11 = fVar11 * auVar13._0_4_;
          fVar12 = fVar12 * auVar13._0_4_;
        }
        pIVar6[iVar8].x = fVar12;
        pIVar6[iVar8].y = -fVar11;
        iVar8 = (int)uVar7;
      }
      uVar9 = uVar2;
      for (uVar7 = 0; (uint)points_count != uVar7; uVar7 = uVar7 + 1) {
        fVar11 = (pIVar6[uVar7].x + pIVar6[iVar10].x) * 0.5;
        fVar12 = (pIVar6[uVar7].y + pIVar6[iVar10].y) * 0.5;
        fVar14 = fVar11 * fVar11 + fVar12 * fVar12;
        if (1e-06 < fVar14) {
          fVar14 = 1.0 / fVar14;
          fVar15 = 100.0;
          if (fVar14 <= 100.0) {
            fVar15 = fVar14;
          }
          fVar11 = fVar11 * fVar15;
          fVar12 = fVar12 * fVar15;
        }
        fVar11 = fVar11 * (float)local_58._0_4_ * 0.5;
        fVar12 = fVar12 * (float)local_58._0_4_ * 0.5;
        pIVar4 = this->_VtxWritePtr;
        IVar16.x = points[uVar7].x - fVar11;
        IVar16.y = points[uVar7].y - fVar12;
        pIVar4->pos = IVar16;
        pIVar4->uv = IVar3;
        pIVar4 = this->_VtxWritePtr;
        pIVar4->col = col;
        IVar17.x = points[uVar7].x + fVar11;
        IVar17.y = points[uVar7].y + fVar12;
        pIVar4[1].pos = IVar17;
        pIVar4[1].uv = IVar3;
        pIVar4 = this->_VtxWritePtr;
        pIVar4[1].col = col & 0xffffff;
        this->_VtxWritePtr = pIVar4 + 2;
        puVar5 = this->_IdxWritePtr;
        *puVar5 = uVar9;
        puVar5[1] = uVar2 + iVar10 * 2;
        uVar1 = uVar2 + 1 + iVar10 * 2;
        puVar5[2] = uVar1;
        puVar5[3] = uVar1;
        puVar5[4] = uVar9 + 1;
        puVar5[5] = uVar9;
        this->_IdxWritePtr = puVar5 + 6;
        iVar10 = (int)uVar7;
        uVar9 = uVar9 + 2;
      }
    }
    *local_90 = *local_90 + local_94;
  }
  return;
}

Assistant:

void ImDrawList::AddConcavePolyFilled(const ImVec2* points, const int points_count, ImU32 col)
{
    if (points_count < 3 || (col & IM_COL32_A_MASK) == 0)
        return;

    const ImVec2 uv = _Data->TexUvWhitePixel;
    ImTriangulator triangulator;
    unsigned int triangle[3];
    if (Flags & ImDrawListFlags_AntiAliasedFill)
    {
        // Anti-aliased Fill
        const float AA_SIZE = _FringeScale;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;
        const int idx_count = (points_count - 2) * 3 + points_count * 6;
        const int vtx_count = (points_count * 2);
        PrimReserve(idx_count, vtx_count);

        // Add indexes for fill
        unsigned int vtx_inner_idx = _VtxCurrentIdx;
        unsigned int vtx_outer_idx = _VtxCurrentIdx + 1;

        _Data->TempBuffer.reserve_discard((ImTriangulator::EstimateScratchBufferSize(points_count) + sizeof(ImVec2)) / sizeof(ImVec2));
        triangulator.Init(points, points_count, _Data->TempBuffer.Data);
        while (triangulator._TrianglesLeft > 0)
        {
            triangulator.GetNextTriangle(triangle);
            _IdxWritePtr[0] = (ImDrawIdx)(vtx_inner_idx + (triangle[0] << 1)); _IdxWritePtr[1] = (ImDrawIdx)(vtx_inner_idx + (triangle[1] << 1)); _IdxWritePtr[2] = (ImDrawIdx)(vtx_inner_idx + (triangle[2] << 1));
            _IdxWritePtr += 3;
        }

        // Compute normals
        _Data->TempBuffer.reserve_discard(points_count);
        ImVec2* temp_normals = _Data->TempBuffer.Data;
        for (int i0 = points_count - 1, i1 = 0; i1 < points_count; i0 = i1++)
        {
            const ImVec2& p0 = points[i0];
            const ImVec2& p1 = points[i1];
            float dx = p1.x - p0.x;
            float dy = p1.y - p0.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i0].x = dy;
            temp_normals[i0].y = -dx;
        }

        for (int i0 = points_count - 1, i1 = 0; i1 < points_count; i0 = i1++)
        {
            // Average normals
            const ImVec2& n0 = temp_normals[i0];
            const ImVec2& n1 = temp_normals[i1];
            float dm_x = (n0.x + n1.x) * 0.5f;
            float dm_y = (n0.y + n1.y) * 0.5f;
            IM_FIXNORMAL2F(dm_x, dm_y);
            dm_x *= AA_SIZE * 0.5f;
            dm_y *= AA_SIZE * 0.5f;

            // Add vertices
            _VtxWritePtr[0].pos.x = (points[i1].x - dm_x); _VtxWritePtr[0].pos.y = (points[i1].y - dm_y); _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;        // Inner
            _VtxWritePtr[1].pos.x = (points[i1].x + dm_x); _VtxWritePtr[1].pos.y = (points[i1].y + dm_y); _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col_trans;  // Outer
            _VtxWritePtr += 2;

            // Add indexes for fringes
            _IdxWritePtr[0] = (ImDrawIdx)(vtx_inner_idx + (i1 << 1)); _IdxWritePtr[1] = (ImDrawIdx)(vtx_inner_idx + (i0 << 1)); _IdxWritePtr[2] = (ImDrawIdx)(vtx_outer_idx + (i0 << 1));
            _IdxWritePtr[3] = (ImDrawIdx)(vtx_outer_idx + (i0 << 1)); _IdxWritePtr[4] = (ImDrawIdx)(vtx_outer_idx + (i1 << 1)); _IdxWritePtr[5] = (ImDrawIdx)(vtx_inner_idx + (i1 << 1));
            _IdxWritePtr += 6;
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // Non Anti-aliased Fill
        const int idx_count = (points_count - 2) * 3;
        const int vtx_count = points_count;
        PrimReserve(idx_count, vtx_count);
        for (int i = 0; i < vtx_count; i++)
        {
            _VtxWritePtr[0].pos = points[i]; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr++;
        }
        _Data->TempBuffer.reserve_discard((ImTriangulator::EstimateScratchBufferSize(points_count) + sizeof(ImVec2)) / sizeof(ImVec2));
        triangulator.Init(points, points_count, _Data->TempBuffer.Data);
        while (triangulator._TrianglesLeft > 0)
        {
            triangulator.GetNextTriangle(triangle);
            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx + triangle[0]); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx + triangle[1]); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx + triangle[2]);
            _IdxWritePtr += 3;
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
}